

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

size_type __thiscall
google::protobuf::internal::KeyMapBase<unsigned_long>::EraseImpl
          (KeyMapBase<unsigned_long> *this,map_index_t b,KeyNode *node,bool do_destroy)

{
  NodeBase *pNVar1;
  Nonnull<const_char_*> failure_msg;
  NodeBase **ppNVar2;
  uint uVar3;
  NodeBase *pNVar4;
  uint uVar5;
  NodeAndBucket NVar6;
  LogMessageFatal LStack_38;
  
  uVar5 = (this->super_UntypedMapBase).num_buckets_ - 1 & b;
  pNVar1 = (NodeBase *)((this->super_UntypedMapBase).table_ + uVar5);
  do {
    pNVar4 = pNVar1;
    pNVar1 = (((KeyNode *)pNVar4)->super_NodeBase).next;
    if (pNVar1 == (NodeBase *)0x0) break;
  } while (pNVar1 != &node->super_NodeBase);
  if (pNVar1 == (NodeBase *)0x0) {
    NVar6 = FindHelper(this,(ViewType_conflict1)node[1].super_NodeBase.next);
    uVar5 = NVar6.bucket;
    pNVar1 = (NodeBase *)((this->super_UntypedMapBase).table_ + uVar5);
    do {
      pNVar4 = pNVar1;
      pNVar1 = ((NodeBase *)&pNVar4->next)->next;
      if (pNVar1 == (NodeBase *)0x0) break;
    } while (pNVar1 != &node->super_NodeBase);
  }
  pNVar1 = (((KeyNode *)pNVar4)->super_NodeBase).next;
  if (pNVar1 == &node->super_NodeBase) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                            (pNVar1,node,"*prev == node");
  }
  if (failure_msg != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&LStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
               ,0x2d4,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_38);
  }
  (((KeyNode *)pNVar4)->super_NodeBase).next = ((((KeyNode *)pNVar4)->super_NodeBase).next)->next;
  (this->super_UntypedMapBase).num_elements_ = (this->super_UntypedMapBase).num_elements_ - 1;
  if (uVar5 == (this->super_UntypedMapBase).index_of_first_non_null_) {
    uVar5 = (this->super_UntypedMapBase).num_buckets_;
    uVar3 = (this->super_UntypedMapBase).index_of_first_non_null_;
    if (uVar3 < uVar5) {
      ppNVar2 = (this->super_UntypedMapBase).table_ + uVar3;
      do {
        uVar3 = uVar3 + 1;
        if (*ppNVar2 != (NodeBase *)0x0) break;
        (this->super_UntypedMapBase).index_of_first_non_null_ = uVar3;
        ppNVar2 = ppNVar2 + 1;
      } while (uVar3 != uVar5);
    }
  }
  if (do_destroy && (this->super_UntypedMapBase).arena_ == (Arena *)0x0) {
    UntypedMapBase::DeleteNode(&this->super_UntypedMapBase,&node->super_NodeBase);
  }
  return 1;
}

Assistant:

PROTOBUF_NOINLINE size_type EraseImpl(map_index_t b, KeyNode* node,
                                        bool do_destroy) {
    // Force bucket_index to be in range.
    b &= (num_buckets_ - 1);

    const auto find_prev = [&] {
      NodeBase** prev = table_ + b;
      for (; *prev != nullptr && *prev != node; prev = &(*prev)->next) {
      }
      return prev;
    };

    NodeBase** prev = find_prev();
    if (*prev == nullptr) {
      // The bucket index is wrong. The table was modified since the iterator
      // was made, so let's find the new bucket.
      b = FindHelper(TS::ToView(node->key())).bucket;
      prev = find_prev();
    }
    ABSL_DCHECK_EQ(*prev, node);
    *prev = (*prev)->next;

    --num_elements_;
    if (ABSL_PREDICT_FALSE(b == index_of_first_non_null_)) {
      while (index_of_first_non_null_ < num_buckets_ &&
             table_[index_of_first_non_null_] == nullptr) {
        ++index_of_first_non_null_;
      }
    }

    if (arena() == nullptr && do_destroy) {
      DeleteNode(node);
    }

    // To allow for the other overload of EraseImpl to do a tail call.
    return 1;
  }